

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>::
insert<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry,capnp::_::RawSchema*&>
          (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
                 table,size_t pos,RawSchema **params)

{
  size_t *psVar1;
  uint uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  uint uVar4;
  Entry *this_00;
  uint *puVar5;
  uint uVar6;
  unsigned_long uVar7;
  RawSchema **in_R9;
  uint *puVar8;
  Maybe<unsigned_long> MVar9;
  
  this_00 = table.ptr;
  if ((ulong)((long)this_00[1].key.super_StringPtr.content.ptr * 2) <
      ((this_00->key).super_StringPtr.content.size_ + pos) * 3 + 3) {
    HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>::
    rehash((HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>
            *)this_00,pos * 3 + 3);
  }
  uVar4 = hashCode<capnp::_::RawSchema*&>(in_R9);
  aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
          ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this_00 + 1))->value;
  uVar6 = (int)aVar3.value - 1U & uVar4;
  puVar5 = (uint *)0x0;
  do {
    puVar8 = (uint *)(*(long *)&this_00->value + (ulong)uVar6 * 8);
    uVar2 = puVar8[1];
    if (uVar2 == 1) {
      if (puVar5 == (uint *)0x0) {
        puVar5 = puVar8;
      }
    }
    else {
      if (uVar2 == 0) {
        if (puVar5 != (uint *)0x0) {
          psVar1 = &(this_00->key).super_StringPtr.content.size_;
          *psVar1 = *psVar1 - 1;
          puVar8 = puVar5;
        }
        *(ulong *)puVar8 = ((ulong)uVar4 | (long)params << 0x20) + 0x200000000;
        *this = (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
                 )0x0;
        goto LAB_00142fc7;
      }
      if ((*puVar8 == uVar4) && (*(RawSchema **)(table.size_ + (ulong)(uVar2 - 2) * 0x28) == *in_R9)
         ) {
        *this = (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
LAB_00142fc7:
        MVar9.ptr.field_1.value = aVar3.value;
        MVar9.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar9.ptr;
      }
    }
    uVar7 = (ulong)uVar6 + 1;
    uVar6 = (uint)uVar7;
    if (uVar7 == aVar3.value) {
      uVar6 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }